

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcNdr.c
# Opt level: O3

void Ndr_ObjReadConstant(Vec_Int_t *vFanins,char *pStr)

{
  char cVar1;
  size_t sVar2;
  ulong uVar3;
  int *piVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  char *pcVar8;
  int iVar9;
  uint uVar10;
  
  if (pStr != (char *)0x0) {
    sVar2 = strlen(pStr);
    uVar10 = (uint)sVar2;
    if ((int)uVar10 < 1) {
      uVar3 = 0;
    }
    else {
      uVar3 = 0;
      do {
        if (pStr[uVar3] == 'b') goto LAB_003661e9;
        uVar3 = uVar3 + 1;
      } while ((uVar10 & 0x7fffffff) != uVar3);
      uVar3 = sVar2 & 0xffffffff;
    }
LAB_003661e9:
    if (pStr[uVar3 & 0xffffffff] == 'b') {
      uVar7 = (uint)uVar3;
      uVar5 = (((int)(~uVar7 + uVar10) >> 5) + 1) - (uint)((~uVar7 + uVar10 & 0x1f) == 0);
      if (vFanins->nCap < (int)uVar5) {
        if (vFanins->pArray == (int *)0x0) {
          piVar4 = (int *)malloc((long)(int)uVar5 << 2);
        }
        else {
          piVar4 = (int *)realloc(vFanins->pArray,(long)(int)uVar5 << 2);
        }
        vFanins->pArray = piVar4;
        if (piVar4 == (int *)0x0) {
          __assert_fail("p->pArray",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
        }
        vFanins->nCap = uVar5;
      }
      if (0 < (int)uVar5) {
        memset(vFanins->pArray,0,(ulong)uVar5 << 2);
      }
      vFanins->nSize = uVar5;
      iVar9 = uVar7 + 1;
      if (iVar9 < (int)uVar10) {
        iVar6 = (uVar10 - uVar7) + -2;
        pcVar8 = pStr + (uVar3 & 0xffffffff);
        do {
          pcVar8 = pcVar8 + 1;
          cVar1 = *pcVar8;
          if (cVar1 != '0') {
            if (cVar1 == '1') {
              vFanins->pArray[iVar6 >> 5] = vFanins->pArray[iVar6 >> 5] | 1 << ((byte)iVar6 & 0x1f);
            }
            else {
              printf("Wrongn symbol (%c) in binary Verilog constant \"%s\".\n",
                     (ulong)(uint)(int)cVar1,pStr);
            }
          }
          iVar6 = iVar6 + -1;
          iVar9 = iVar9 + 1;
        } while (iVar9 < (int)uVar10);
      }
      return;
    }
  }
  puts(
      "Constants should be represented in binary Verilog notation <nbits>\'b<bits> as char strings (for example, \"4\'b1010\")."
      );
  return;
}

Assistant:

void Ndr_ObjReadConstant( Vec_Int_t * vFanins, char * pStr )
{
    int i, k, Len = pStr ? strlen(pStr) : 0;
    for ( k = 0; k < Len; k++ )
        if ( pStr[k] == 'b' )
            break;
    if ( pStr == NULL || pStr[k] != 'b' )
    {
        printf( "Constants should be represented in binary Verilog notation <nbits>\'b<bits> as char strings (for example, \"4'b1010\").\n" );
        return;
    }
    Vec_IntFill( vFanins, Abc_BitWordNum(Len-k-1), 0 );
    for ( i = k+1; i < Len; i++ )
        if ( pStr[i] == '1' )
            Abc_InfoSetBit( (unsigned *)Vec_IntArray(vFanins), Len-i-1 );
        else if ( pStr[i] != '0' )
            printf( "Wrongn symbol (%c) in binary Verilog constant \"%s\".\n", pStr[i], pStr );
}